

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sanity.cpp
# Opt level: O3

void __thiscall
cubeb_init_destroy_multiple_contexts_Test::TestBody(cubeb_init_destroy_multiple_contexts_Test *this)

{
  bool bVar1;
  stringstream *this_00;
  AssertHelperData *pAVar2;
  int line;
  internal *actual;
  internal *ctx_00;
  long lVar3;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  char *pcVar4;
  AssertionResult gtest_ar_1;
  int r;
  cubeb *ctx [4];
  AssertHelper local_80;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  int local_64;
  AssertHelper local_60;
  internal local_58 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50 [4];
  
  actual = (internal *)&local_78;
  local_78.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
  local_80.data_ = (AssertHelperData *)0x4;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_58,"ARRAY_LENGTH(ctx)","ARRAY_LENGTH(order)",(unsigned_long *)actual,
             (unsigned_long *)&local_80);
  if (local_58[0] == (internal)0x0) {
    this_00 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(this_00);
    *(undefined8 *)(this_00 + *(long *)(*(long *)(this_00 + 0x10) + -0x18) + 0x18) = 0x11;
    if (local_50[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_50[0].ptr_)->_M_dataplus)._M_p;
    }
    this_01 = local_50;
    local_78.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00;
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
               ,0x65,pcVar4);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (((local_78.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_78.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_78.ptr_ + 8))();
    }
LAB_00107dd8:
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    lVar3 = 0;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    do {
      ctx_00 = local_58 + lVar3;
      local_64 = common_init((cubeb **)ctx_00,(char *)0x0);
      local_80.data_ = local_80.data_ & 0xffffffff00000000;
      testing::internal::EqHelper<false>::Compare<int,__0>
                ((char *)&local_78,(char *)&local_64,(int *)&local_80,(anon_enum_32 *)actual);
      if (local_78.ptr_._0_1_ == (internal)0x0) {
        pAVar2 = (AssertHelperData *)operator_new(0x188);
        std::__cxx11::stringstream::stringstream((stringstream *)pAVar2);
        *(undefined8 *)((long)&(pAVar2->message).c_str_ + *(long *)(*(long *)&pAVar2->line + -0x18))
             = 0x11;
        if (local_70.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((local_70.ptr_)->_M_dataplus)._M_p;
        }
        line = 0x69;
        local_80.data_ = pAVar2;
LAB_00107d92:
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                   ,line,pcVar4);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (((local_80.data_ != (AssertHelperData *)0x0) &&
            (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
           (local_80.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_80.data_ + 8))();
        }
        this_01 = &local_70;
        goto LAB_00107dd8;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_80.data_ = (AssertHelperData *)0x0;
      testing::internal::CmpHelperNE<cubeb*,decltype(nullptr)>
                ((internal *)&local_78,"ctx[i]","nullptr",(cubeb **)ctx_00,&local_80.data_);
      if (local_78.ptr_._0_1_ == (internal)0x0) {
        pAVar2 = (AssertHelperData *)operator_new(0x188);
        std::__cxx11::stringstream::stringstream((stringstream *)pAVar2);
        *(undefined8 *)((long)&(pAVar2->message).c_str_ + *(long *)(*(long *)&pAVar2->line + -0x18))
             = 0x11;
        if (local_70.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((local_70.ptr_)->_M_dataplus)._M_p;
        }
        line = 0x6a;
        local_80.data_ = pAVar2;
        goto LAB_00107d92;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar3 = lVar3 + 8;
      actual = ctx_00;
    } while (lVar3 != 0x20);
    lVar3 = 0;
    do {
      cubeb_destroy((cubeb *)local_50[(long)*(int *)((long)&DAT_0012d040 + lVar3) + -1].ptr_);
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x10);
  }
  return;
}

Assistant:

TEST(cubeb, init_destroy_multiple_contexts)
{
  size_t i;
  int r;
  cubeb * ctx[4];
  int order[4] = {2, 0, 3, 1};
  ASSERT_EQ(ARRAY_LENGTH(ctx), ARRAY_LENGTH(order));

  for (i = 0; i < ARRAY_LENGTH(ctx); ++i) {
    r = common_init(&ctx[i], NULL);
    ASSERT_EQ(r, CUBEB_OK);
    ASSERT_NE(ctx[i], nullptr);
  }

  /* destroy in a different order */
  for (i = 0; i < ARRAY_LENGTH(ctx); ++i) {
    cubeb_destroy(ctx[order[i]]);
  }
}